

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O3

int raft_server_test::update_params_test(void)

{
  _func_int **pp_Var1;
  RaftPkg *pRVar2;
  undefined4 uVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  int __how;
  int __how_00;
  int __how_01;
  raft_params *prVar7;
  raft_params *prVar8;
  pointer ppRVar9;
  _func_int *p_Var10;
  byte bVar11;
  initializer_list<RaftPkg_*> __l;
  ptr<FakeNetworkBase> f_base;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  string s2_addr;
  string s1_addr;
  string s3_addr;
  raft_params param;
  RaftPkg s1;
  RaftPkg s3;
  RaftPkg s2;
  ptr<FakeNetworkBase> local_568;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> local_558;
  string local_540;
  string local_520;
  string local_500;
  undefined1 local_4e0 [16];
  RaftPkg *local_4d0 [10];
  bool local_47c;
  bool bStack_47b;
  bool local_47a;
  element_type *local_478;
  undefined1 local_470 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_460 [5];
  bool local_40c;
  bool bStack_40b;
  bool local_40a;
  RaftPkg local_408;
  RaftPkg local_2c0;
  RaftPkg local_178;
  
  bVar11 = 0;
  raft_functional_common::reset_log_files();
  local_568.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FakeNetworkBase *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::FakeNetworkBase,std::allocator<nuraft::FakeNetworkBase>>
            (&local_568.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FakeNetworkBase **)&local_568,
             (allocator<nuraft::FakeNetworkBase> *)&local_408);
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"S1","");
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"S2","");
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"S3","");
  RaftPkg::RaftPkg(&local_408,&local_568,1,&local_520);
  RaftPkg::RaftPkg(&local_178,&local_568,2,&local_540);
  RaftPkg::RaftPkg(&local_2c0,&local_568,3,&local_500);
  __l._M_len = 3;
  __l._M_array = (iterator)local_4e0;
  local_4e0._0_8_ = &local_408;
  local_4e0._8_8_ = &local_178;
  local_4d0[0] = &local_2c0;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            (&local_558,__l,(allocator_type *)local_470);
  prVar7 = (raft_params *)0x0;
  iVar4 = launch_servers(&local_558,(raft_params *)0x0,false);
  if (iVar4 == 0) {
    iVar4 = make_group(&local_558);
    if (iVar4 == 0) {
      if (local_558.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_558.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ppRVar9 = local_558.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          pRVar2 = *ppRVar9;
          nuraft::raft_server::get_current_params
                    ((raft_params *)local_4e0,
                     (pRVar2->raftServer).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          iVar4 = local_4e0._0_4_ + 1;
          local_4e0._0_4_ = iVar4;
          nuraft::raft_server::update_params
                    ((pRVar2->raftServer).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (raft_params *)local_4e0);
          nuraft::raft_server::get_current_params
                    ((raft_params *)local_470,
                     (pRVar2->raftServer).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          prVar7 = (raft_params *)local_470;
          prVar8 = (raft_params *)local_4e0;
          for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
            prVar8->election_timeout_upper_bound_ = prVar7->election_timeout_upper_bound_;
            prVar7 = (raft_params *)((long)prVar7 + (ulong)bVar11 * -8 + 4);
            prVar8 = (raft_params *)((long)prVar8 + (ulong)bVar11 * -8 + 4);
          }
          local_47a = local_40a;
          local_47c = local_40c;
          bStack_47b = bStack_40b;
          uVar3 = local_4e0._0_4_;
          if (iVar4 != local_4e0._0_4_) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
            std::ostream::put(-0x68);
            poVar5 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        time: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;30m",7);
            TestSuite::getTimeString_abi_cxx11_();
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_470._0_8_,local_470._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      thread: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[33m",5);
            pp_Var1 = poVar5->_vptr_basic_ostream;
            *(uint *)(&poVar5->field_0x18 + (long)pp_Var1[-3]) =
                 *(uint *)(&poVar5->field_0x18 + (long)pp_Var1[-3]) & 0xffffffb5 | 8;
            *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var1[-3]) = 4;
            p_Var10 = (_func_int *)((long)&poVar5->_vptr_basic_ostream + (long)pp_Var1[-3]);
            if ((&poVar5->field_0xe1)[(long)pp_Var1[-3]] == '\0') {
              std::ios::widen((char)p_Var10);
              p_Var10[0xe1] = (code)0x1;
            }
            p_Var10[0xe0] = (code)0x30;
            local_478 = (element_type *)pthread_self();
            std::_Hash_bytes(&local_478,8,0xc70f6907);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
                 *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5
                 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          in: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[36m",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"update_params_test",0x12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"()\x1b[0m",6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          at: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[32m",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                       ,0x6a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m:",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;35m",7);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"    value of: \x1b[1;34mparam.election_timeout_upper_bound_\x1b[0m\n"
                       ,0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"    expected: \x1b[1;32m",0x15);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"      actual: \x1b[1;31m",0x15);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._0_8_ != local_460) {
              operator_delete((void *)local_470._0_8_);
            }
            TestSuite::failHandler();
            iVar4 = -1;
            goto LAB_001111c2;
          }
          ppRVar9 = ppRVar9 + 1;
        } while (ppRVar9 !=
                 local_558.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      iVar4 = (int)prVar7;
      print_stats(&local_558);
      nuraft::raft_server::shutdown
                (local_408.raftServer.
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar4,
                 __how);
      nuraft::raft_server::shutdown
                (local_178.raftServer.
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar4,
                 __how_00);
      nuraft::raft_server::shutdown
                (local_2c0.raftServer.
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar4,
                 __how_01);
      iVar4 = 0;
      nuraft::FakeNetworkBase::destroy
                (local_568.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_4e0._0_8_,local_4e0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[33m",5);
      pp_Var1 = poVar5->_vptr_basic_ostream;
      *(uint *)(&poVar5->field_0x18 + (long)pp_Var1[-3]) =
           *(uint *)(&poVar5->field_0x18 + (long)pp_Var1[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var1[-3]) = 4;
      p_Var10 = (_func_int *)((long)&poVar5->_vptr_basic_ostream + (long)pp_Var1[-3]);
      if ((&poVar5->field_0xe1)[(long)pp_Var1[-3]] == '\0') {
        std::ios::widen((char)p_Var10);
        p_Var10[0xe1] = (code)0x1;
      }
      p_Var10[0xe0] = (code)0x30;
      local_470._0_8_ = pthread_self();
      std::_Hash_bytes(local_470,8,0xc70f6907);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"update_params_test",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;35m",7);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      actual: \x1b[1;31m",0x15);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
      if ((RaftPkg *)local_4e0._0_8_ != (RaftPkg *)local_4d0) {
        operator_delete((void *)local_4e0._0_8_);
      }
      iVar4 = -1;
      TestSuite::failHandler();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_4e0._0_8_,local_4e0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[33m",5);
    pp_Var1 = poVar5->_vptr_basic_ostream;
    *(uint *)(&poVar5->field_0x18 + (long)pp_Var1[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)pp_Var1[-3]) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var1[-3]) = 4;
    p_Var10 = (_func_int *)((long)&poVar5->_vptr_basic_ostream + (long)pp_Var1[-3]);
    if ((&poVar5->field_0xe1)[(long)pp_Var1[-3]] == '\0') {
      std::ios::widen((char)p_Var10);
      p_Var10[0xe1] = (code)0x1;
    }
    p_Var10[0xe0] = (code)0x30;
    local_470._0_8_ = pthread_self();
    std::_Hash_bytes(local_470,8,0xc70f6907);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"update_params_test",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;35m",7);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      actual: \x1b[1;31m",0x15);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
    if ((RaftPkg *)local_4e0._0_8_ != (RaftPkg *)local_4d0) {
      operator_delete((void *)local_4e0._0_8_);
    }
    iVar4 = -1;
    TestSuite::failHandler();
  }
LAB_001111c2:
  if (local_558.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  RaftPkg::~RaftPkg(&local_2c0);
  RaftPkg::~RaftPkg(&local_178);
  RaftPkg::~RaftPkg(&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if (local_568.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_568.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar4;
}

Assistant:

int update_params_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    for (auto& entry: pkgs) {
        RaftPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        int old_value = param.election_timeout_upper_bound_;
        param.with_election_timeout_upper( old_value + 1 );
        pp->raftServer->update_params(param);

        param = pp->raftServer->get_current_params();
        CHK_EQ( old_value + 1, param.election_timeout_upper_bound_ );
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();

    f_base->destroy();

    return 0;
}